

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

uint8 * google::protobuf::internal::InternalSerializeMapEntry
                  (FieldDescriptor *field,MapKey *key,MapValueRef *value,uint8 *target,
                  EpsCopyOutputStream *stream)

{
  int field_number;
  uint32 value_00;
  Descriptor *pDVar1;
  size_t sVar2;
  EpsCopyOutputStream *pEVar3;
  uint8 *puVar4;
  uint8 *in_RCX;
  uint8 *in_RDX;
  MapValueRef *in_RSI;
  FieldDescriptor *in_RDI;
  size_t size;
  FieldDescriptor *value_field;
  FieldDescriptor *key_field;
  FieldDescriptor *in_stack_00000048;
  MapKey *in_stack_000000a0;
  FieldDescriptor *in_stack_000000a8;
  uint8 **in_stack_ffffffffffffff98;
  uint32 value_01;
  FieldDescriptor *in_stack_ffffffffffffffa0;
  long lVar5;
  
  pDVar1 = FieldDescriptor::message_type(in_stack_ffffffffffffffa0);
  Descriptor::field(pDVar1,0);
  pDVar1 = FieldDescriptor::message_type(in_stack_ffffffffffffffa0);
  Descriptor::field(pDVar1,1);
  lVar5 = 2;
  sVar2 = MapKeyDataOnlyByteSize(in_stack_000000a8,in_stack_000000a0);
  lVar5 = sVar2 + lVar5;
  sVar2 = MapValueRefDataOnlyByteSize(in_stack_00000048,(MapValueRef *)field);
  pEVar3 = (EpsCopyOutputStream *)(sVar2 + lVar5);
  io::EpsCopyOutputStream::EnsureSpace(pEVar3,in_stack_ffffffffffffff98);
  value_01 = (uint32)pEVar3;
  field_number = FieldDescriptor::number(in_RDI);
  value_00 = WireFormatLite::MakeTag(field_number,WIRETYPE_LENGTH_DELIMITED);
  puVar4 = io::CodedOutputStream::WriteVarint32ToArray(value_00,in_RCX);
  io::CodedOutputStream::WriteVarint32ToArray(value_01,puVar4);
  pEVar3 = (EpsCopyOutputStream *)
           SerializeMapKeyWithCachedSizes
                     ((FieldDescriptor *)value,(MapKey *)target,(uint8 *)stream,
                      (EpsCopyOutputStream *)key_field);
  puVar4 = SerializeMapValueRefWithCachedSizes(in_RDI,in_RSI,in_RDX,pEVar3);
  return puVar4;
}

Assistant:

static uint8* InternalSerializeMapEntry(const FieldDescriptor* field,
                                        const MapKey& key,
                                        const MapValueRef& value, uint8* target,
                                        io::EpsCopyOutputStream* stream) {
  const FieldDescriptor* key_field = field->message_type()->field(0);
  const FieldDescriptor* value_field = field->message_type()->field(1);

  size_t size = kMapEntryTagByteSize;
  size += MapKeyDataOnlyByteSize(key_field, key);
  size += MapValueRefDataOnlyByteSize(value_field, value);
  stream->EnsureSpace(&target);
  target = WireFormatLite::WriteTagToArray(
      field->number(), WireFormatLite::WIRETYPE_LENGTH_DELIMITED, target);
  target = io::CodedOutputStream::WriteVarint32ToArray(size, target);
  target = SerializeMapKeyWithCachedSizes(key_field, key, target, stream);
  target =
      SerializeMapValueRefWithCachedSizes(value_field, value, target, stream);
  return target;
}